

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O2

bool __thiscall
testing::internal::
ElementsAreMatcherImpl<const_absl::lts_20250127::btree_set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_&>
::MatchAndExplain(ElementsAreMatcherImpl<const_absl::lts_20250127::btree_set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_&>
                  *this,btree_set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                        *container,MatchResultListener *listener)

{
  ostream *poVar1;
  pointer pbVar2;
  bool bVar3;
  reference pbVar4;
  MatchResultListener *pMVar5;
  pointer pMVar6;
  long lVar7;
  pointer pMVar8;
  _func_int **pp_Var9;
  size_t count;
  bool bVar10;
  const_iterator cVar11;
  long local_228;
  size_t local_218;
  btree_iterator<const_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_256,_false>_>,_const_std::basic_string_view<char,_std::char_traits<char>_>_&,_const_std::basic_string_view<char,_std::char_traits<char>_>_*>
  local_210;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  explanations;
  StringMatchResultListener s;
  string local_50 [32];
  
  poVar1 = listener->stream_;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&explanations,
           ((long)(this->matchers_).
                  super__Vector_base<testing::Matcher<const_std::basic_string_view<char,_std::char_traits<char>_>_&>,_std::allocator<testing::Matcher<const_std::basic_string_view<char,_std::char_traits<char>_>_&>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->matchers_).
                 super__Vector_base<testing::Matcher<const_std::basic_string_view<char,_std::char_traits<char>_>_&>,_std::allocator<testing::Matcher<const_std::basic_string_view<char,_std::char_traits<char>_>_&>_>_>
                 ._M_impl.super__Vector_impl_data._M_start) / 0x18,(allocator_type *)&s);
  cVar11 = absl::lts_20250127::container_internal::
           btree<absl::lts_20250127::container_internal::set_params<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_256,_false>_>
           ::begin((btree<absl::lts_20250127::container_internal::set_params<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_256,_false>_>
                    *)container);
  local_210.node_ = cVar11.node_;
  local_210.position_ = cVar11.position_;
  lVar7 = 0;
  local_228 = 0;
  count = 0;
  while( true ) {
    local_218 = count;
    cVar11 = absl::lts_20250127::container_internal::
             btree<absl::lts_20250127::container_internal::set_params<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_256,_false>_>
             ::end((btree<absl::lts_20250127::container_internal::set_params<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_256,_false>_>
                    *)container);
    s.super_MatchResultListener._vptr_MatchResultListener = (_func_int **)cVar11.node_;
    s.super_MatchResultListener.stream_._0_4_ = cVar11.position_;
    bVar3 = absl::lts_20250127::container_internal::
            btree_iterator<const_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_256,_false>_>,_const_std::basic_string_view<char,_std::char_traits<char>_>_&,_const_std::basic_string_view<char,_std::char_traits<char>_>_*>
            ::operator!=(&local_210,(const_iterator *)&s);
    if (!bVar3) break;
    pMVar6 = (this->matchers_).
             super__Vector_base<testing::Matcher<const_std::basic_string_view<char,_std::char_traits<char>_>_&>,_std::allocator<testing::Matcher<const_std::basic_string_view<char,_std::char_traits<char>_>_&>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    bVar10 = count == ((long)(this->matchers_).
                             super__Vector_base<testing::Matcher<const_std::basic_string_view<char,_std::char_traits<char>_>_&>,_std::allocator<testing::Matcher<const_std::basic_string_view<char,_std::char_traits<char>_>_&>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pMVar6) / 0x18;
    bVar3 = !bVar10;
    if (bVar10) goto LAB_004e3352;
    if (poVar1 == (ostream *)0x0) {
      pbVar4 = absl::lts_20250127::container_internal::
               btree_iterator<const_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_256,_false>_>,_const_std::basic_string_view<char,_std::char_traits<char>_>_&,_const_std::basic_string_view<char,_std::char_traits<char>_>_*>
               ::operator*(&local_210);
      bVar10 = MatcherBase<const_std::basic_string_view<char,_std::char_traits<char>_>_&>::Matches
                         ((MatcherBase<const_std::basic_string_view<char,_std::char_traits<char>_>_&>
                           *)((long)&(pMVar6->
                                     super_MatcherBase<const_std::basic_string_view<char,_std::char_traits<char>_>_&>
                                     ).super_MatcherDescriberInterface.
                                     _vptr_MatcherDescriberInterface + lVar7),pbVar4);
    }
    else {
      StringMatchResultListener::StringMatchResultListener(&s);
      pMVar6 = (this->matchers_).
               super__Vector_base<testing::Matcher<const_std::basic_string_view<char,_std::char_traits<char>_>_&>,_std::allocator<testing::Matcher<const_std::basic_string_view<char,_std::char_traits<char>_>_&>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pbVar4 = absl::lts_20250127::container_internal::
               btree_iterator<const_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_256,_false>_>,_const_std::basic_string_view<char,_std::char_traits<char>_>_&,_const_std::basic_string_view<char,_std::char_traits<char>_>_*>
               ::operator*(&local_210);
      bVar10 = MatcherBase<const_std::basic_string_view<char,_std::char_traits<char>_>_&>::
               MatchAndExplain((MatcherBase<const_std::basic_string_view<char,_std::char_traits<char>_>_&>
                                *)((long)&(pMVar6->
                                          super_MatcherBase<const_std::basic_string_view<char,_std::char_traits<char>_>_&>
                                          ).super_MatcherDescriberInterface.
                                          _vptr_MatcherDescriberInterface + lVar7),pbVar4,
                               &s.super_MatchResultListener);
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::operator=
                ((string *)
                 ((long)&((explanations.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + local_228
                 ),local_50);
      std::__cxx11::string::~string(local_50);
      StringMatchResultListener::~StringMatchResultListener(&s);
    }
    if (!bVar10) goto LAB_004e3352;
    absl::lts_20250127::container_internal::
    btree_iterator<const_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_256,_false>_>,_const_std::basic_string_view<char,_std::char_traits<char>_>_&,_const_std::basic_string_view<char,_std::char_traits<char>_>_*>
    ::increment(&local_210);
    count = count + 1;
    local_228 = local_228 + 0x20;
    lVar7 = lVar7 + 0x18;
  }
  bVar3 = false;
LAB_004e3352:
  while( true ) {
    cVar11 = absl::lts_20250127::container_internal::
             btree<absl::lts_20250127::container_internal::set_params<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_256,_false>_>
             ::end((btree<absl::lts_20250127::container_internal::set_params<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_256,_false>_>
                    *)container);
    s.super_MatchResultListener._vptr_MatchResultListener = (_func_int **)cVar11.node_;
    s.super_MatchResultListener.stream_._0_4_ = cVar11.position_;
    bVar10 = absl::lts_20250127::container_internal::
             btree_iterator<const_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_256,_false>_>,_const_std::basic_string_view<char,_std::char_traits<char>_>_&,_const_std::basic_string_view<char,_std::char_traits<char>_>_*>
             ::operator!=(&local_210,(const_iterator *)&s);
    if (!bVar10) break;
    count = count + 1;
    absl::lts_20250127::container_internal::
    btree_iterator<const_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_256,_false>_>,_const_std::basic_string_view<char,_std::char_traits<char>_>_&,_const_std::basic_string_view<char,_std::char_traits<char>_>_*>
    ::increment(&local_210);
  }
  pMVar6 = (this->matchers_).
           super__Vector_base<testing::Matcher<const_std::basic_string_view<char,_std::char_traits<char>_>_&>,_std::allocator<testing::Matcher<const_std::basic_string_view<char,_std::char_traits<char>_>_&>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pMVar8 = (this->matchers_).
           super__Vector_base<testing::Matcher<const_std::basic_string_view<char,_std::char_traits<char>_>_&>,_std::allocator<testing::Matcher<const_std::basic_string_view<char,_std::char_traits<char>_>_&>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (((long)pMVar8 - (long)pMVar6) / 0x18 == count) {
    if (!bVar3) {
      bVar3 = true;
      if (poVar1 != (ostream *)0x0) {
        bVar10 = false;
        pp_Var9 = (_func_int **)0x0;
        while (pbVar2 = explanations.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
              s.super_MatchResultListener._vptr_MatchResultListener = pp_Var9,
              pp_Var9 != (_func_int **)(((long)pMVar8 - (long)pMVar6) / 0x18)) {
          if (explanations.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[(long)pp_Var9]._M_string_length != 0) {
            if (bVar10) {
              MatchResultListener::operator<<(listener,(char (*) [7])",\nand ");
            }
            pMVar5 = MatchResultListener::operator<<(listener,(char (*) [16])"whose element #");
            pMVar5 = MatchResultListener::operator<<(pMVar5,(unsigned_long *)&s);
            pMVar5 = MatchResultListener::operator<<(pMVar5,(char (*) [11])" matches, ");
            MatchResultListener::operator<<(pMVar5,pbVar2 + (long)pp_Var9);
            pMVar6 = (this->matchers_).
                     super__Vector_base<testing::Matcher<const_std::basic_string_view<char,_std::char_traits<char>_>_&>,_std::allocator<testing::Matcher<const_std::basic_string_view<char,_std::char_traits<char>_>_&>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pMVar8 = (this->matchers_).
                     super__Vector_base<testing::Matcher<const_std::basic_string_view<char,_std::char_traits<char>_>_&>,_std::allocator<testing::Matcher<const_std::basic_string_view<char,_std::char_traits<char>_>_&>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            bVar10 = true;
          }
          pp_Var9 = (_func_int **)((long)s.super_MatchResultListener._vptr_MatchResultListener + 1);
        }
      }
      goto LAB_004e3461;
    }
    if (poVar1 != (ostream *)0x0) {
      pMVar5 = MatchResultListener::operator<<(listener,(char (*) [16])"whose element #");
      pMVar5 = MatchResultListener::operator<<(pMVar5,&local_218);
      MatchResultListener::operator<<(pMVar5,(char (*) [15])" doesn\'t match");
      PrintIfNotEmpty(explanations.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + local_218,listener->stream_);
    }
  }
  else if (count != 0 && poVar1 != (ostream *)0x0) {
    pMVar5 = MatchResultListener::operator<<(listener,(char (*) [11])"which has ");
    Elements((ElementsAreMatcherImpl<const_absl::lts_20250127::btree_set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_&>
              *)&s,count);
    MatchResultListener::operator<<(pMVar5,(Message *)&s);
    if (s.super_MatchResultListener._vptr_MatchResultListener != (_func_int **)0x0) {
      (**(code **)(*s.super_MatchResultListener._vptr_MatchResultListener + 8))();
    }
  }
  bVar3 = false;
LAB_004e3461:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&explanations);
  return bVar3;
}

Assistant:

bool MatchAndExplain(Container container,
                       MatchResultListener* listener) const override {
    // To work with stream-like "containers", we must only walk
    // through the elements in one pass.

    const bool listener_interested = listener->IsInterested();

    // explanations[i] is the explanation of the element at index i.
    ::std::vector<std::string> explanations(count());
    StlContainerReference stl_container = View::ConstReference(container);
    auto it = stl_container.begin();
    size_t exam_pos = 0;
    bool mismatch_found = false;  // Have we found a mismatched element yet?

    // Go through the elements and matchers in pairs, until we reach
    // the end of either the elements or the matchers, or until we find a
    // mismatch.
    for (; it != stl_container.end() && exam_pos != count(); ++it, ++exam_pos) {
      bool match;  // Does the current element match the current matcher?
      if (listener_interested) {
        StringMatchResultListener s;
        match = matchers_[exam_pos].MatchAndExplain(*it, &s);
        explanations[exam_pos] = s.str();
      } else {
        match = matchers_[exam_pos].Matches(*it);
      }

      if (!match) {
        mismatch_found = true;
        break;
      }
    }
    // If mismatch_found is true, 'exam_pos' is the index of the mismatch.

    // Find how many elements the actual container has.  We avoid
    // calling size() s.t. this code works for stream-like "containers"
    // that don't define size().
    size_t actual_count = exam_pos;
    for (; it != stl_container.end(); ++it) {
      ++actual_count;
    }

    if (actual_count != count()) {
      // The element count doesn't match.  If the container is empty,
      // there's no need to explain anything as Google Mock already
      // prints the empty container.  Otherwise we just need to show
      // how many elements there actually are.
      if (listener_interested && (actual_count != 0)) {
        *listener << "which has " << Elements(actual_count);
      }
      return false;
    }

    if (mismatch_found) {
      // The element count matches, but the exam_pos-th element doesn't match.
      if (listener_interested) {
        *listener << "whose element #" << exam_pos << " doesn't match";
        PrintIfNotEmpty(explanations[exam_pos], listener->stream());
      }
      return false;
    }

    // Every element matches its expectation.  We need to explain why
    // (the obvious ones can be skipped).
    if (listener_interested) {
      bool reason_printed = false;
      for (size_t i = 0; i != count(); ++i) {
        const std::string& s = explanations[i];
        if (!s.empty()) {
          if (reason_printed) {
            *listener << ",\nand ";
          }
          *listener << "whose element #" << i << " matches, " << s;
          reason_printed = true;
        }
      }
    }
    return true;
  }